

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O3

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,FieldDescriptor *descriptor,MessageFactory *factory)

{
  byte bVar1;
  uint uVar2;
  bool bVar3;
  int iVar4;
  LogMessage *pLVar5;
  undefined4 extraout_var;
  int64 iVar6;
  undefined4 extraout_var_00;
  MessageLite *pMVar7;
  Extension *extension;
  LogFinisher local_59;
  Extension *local_58;
  LogMessage local_50;
  undefined4 extraout_var_01;
  
  bVar3 = MaybeNewExtension(this,*(int *)(descriptor + 0x28),descriptor,&local_58);
  if (bVar3) {
    uVar2 = *(uint *)(descriptor + 0x2c);
    local_58->type = (FieldType)uVar2;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)(uVar2 & 0xff) * 4) != 10) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0x8f);
      pLVar5 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type(extension->type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_50);
    }
    local_58->is_repeated = false;
    local_58->is_packed = false;
    iVar4 = (*factory->_vptr_MessageFactory[2])(factory,*(undefined8 *)(descriptor + 0x48));
    local_58->field_0xa = local_58->field_0xa & 0xf;
    iVar6 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar4) + 0x18))
                      ((long *)CONCAT44(extraout_var,iVar4));
    (local_58->field_0).int64_value = iVar6;
    local_58->field_0xa = local_58->field_0xa & 0xf0;
    pMVar7 = (MessageLite *)(local_58->field_0).int64_value;
  }
  else {
    if (local_58->is_repeated == true) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      pLVar5 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: ((*extension).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_50);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)local_58->type * 4) != 10) {
      LogMessage::LogMessage
                (&local_50,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      pLVar5 = LogMessage::operator<<
                         (&local_50,
                          "CHECK failed: (cpp_type((*extension).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_59,pLVar5);
      LogMessage::~LogMessage(&local_50);
    }
    bVar1 = local_58->field_0xa;
    local_58->field_0xa = bVar1 & 0xf0;
    pMVar7 = (local_58->field_0).message_value;
    if ((bVar1 & 0x10) != 0) {
      iVar4 = (*factory->_vptr_MessageFactory[2])(factory,*(undefined8 *)(descriptor + 0x48));
      iVar4 = (*pMVar7->_vptr_MessageLite[4])(pMVar7,CONCAT44(extraout_var_00,iVar4));
      pMVar7 = (MessageLite *)CONCAT44(extraout_var_01,iVar4);
    }
  }
  return pMVar7;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(const FieldDescriptor* descriptor,
                                          MessageFactory* factory) {
  Extension* extension;
  if (MaybeNewExtension(descriptor->number(), descriptor, &extension)) {
    extension->type = descriptor->type();
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), FieldDescriptor::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_packed = false;
    const MessageLite* prototype =
        factory->GetPrototype(descriptor->message_type());
    extension->is_lazy = false;
    extension->message_value = prototype->New();
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(
          *factory->GetPrototype(descriptor->message_type()));
    } else {
      return extension->message_value;
    }
  }
}